

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::pushError(Reader *this,Value *value,String *message)

{
  Location pCVar1;
  Location pCVar2;
  ptrdiff_t pVar3;
  ptrdiff_t pVar4;
  long lVar5;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  Location local_30;
  
  lVar5 = (long)this->end_ - (long)this->begin_;
  pVar3 = Value::getOffsetStart(value);
  if ((pVar3 <= lVar5) && (pVar3 = Value::getOffsetLimit(value), pVar3 <= lVar5)) {
    pCVar1 = this->begin_;
    pVar3 = Value::getOffsetStart(value);
    pCVar2 = this->begin_;
    pVar4 = Value::getOffsetLimit(value);
    local_68._16_8_ = pCVar2 + pVar4;
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_68._0_4_ = tokenError;
    local_68._8_8_ = pCVar1 + pVar3;
    std::__cxx11::string::_M_assign((string *)&local_50);
    local_30 = (Location)0x0;
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::push_back
              (&this->errors_,(value_type *)local_68);
    std::__cxx11::string::~string((string *)&local_50);
    return true;
  }
  return false;
}

Assistant:

bool Reader::pushError(const Value& value, const String& message) {
  ptrdiff_t const length = end_ - begin_;
  if (value.getOffsetStart() > length || value.getOffsetLimit() > length)
    return false;
  Token token;
  token.type_ = tokenError;
  token.start_ = begin_ + value.getOffsetStart();
  token.end_ = begin_ + value.getOffsetLimit();
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = nullptr;
  errors_.push_back(info);
  return true;
}